

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void rename_cb(uv_fs_t *req)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (req == &rename_req) {
    if (rename_req.fs_type == UV_FS_RENAME) {
      if (rename_req.result == 0) {
        rename_cb_count = rename_cb_count + 1;
        uv_fs_req_cleanup(&rename_req);
        return;
      }
      pcVar2 = "req->result == 0";
      uVar1 = 0x1fd;
    }
    else {
      pcVar2 = "req->fs_type == UV_FS_RENAME";
      uVar1 = 0x1fc;
    }
  }
  else {
    pcVar2 = "req == &rename_req";
    uVar1 = 0x1fb;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar1,pcVar2);
  abort();
}

Assistant:

static void rename_cb(uv_fs_t* req) {
  ASSERT(req == &rename_req);
  ASSERT(req->fs_type == UV_FS_RENAME);
  ASSERT(req->result == 0);
  rename_cb_count++;
  uv_fs_req_cleanup(req);
}